

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O3

path * __thiscall
hta::storage::file::Metric::path_hta_abi_cxx11_
          (path *__return_storage_ptr__,Metric *this,Duration interval)

{
  ostream *poVar1;
  stringstream ss;
  string_type local_1e8;
  path local_1c8;
  stringstream local_1a0 [16];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::ostream::_M_insert<long>((long)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".hta",4);
  std::__cxx11::stringbuf::str();
  std::filesystem::__cxx11::path::path(&local_1c8,&local_1e8,auto_format);
  Catch::clara::std::filesystem::__cxx11::operator/
            ((path *)__return_storage_ptr__,(path *)&this->path_,(path *)&local_1c8);
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::filesystem::path Metric::path_hta(Duration interval)
{
    std::stringstream ss;
    ss << std::chrono::duration_cast<std::chrono::nanoseconds>(interval).count() << ".hta";
    return path_ / std::filesystem::path(ss.str());
}